

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O3

QRectF * __thiscall
QRasterPaintEngine::clipBoundingRect(QRectF *__return_storage_ptr__,QRasterPaintEngine *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QPaintEnginePrivate *pQVar5;
  QPaintEngineState *pQVar6;
  qreal qVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  QPaintEngine *pQVar12;
  byte bVar13;
  
  pQVar5 = (this->super_QPaintEngineEx).super_QPaintEngine.d_ptr.d;
  pQVar6 = pQVar5->q_ptr->state;
  if (((pQVar6 == (QPaintEngineState *)0x0) ||
      (pQVar12 = *(QPaintEngine **)(pQVar6 + 0x100), pQVar12 == (QPaintEngine *)0x0)) ||
     (bVar13 = *(byte *)&pQVar12[2].state, (bVar13 & 1) == 0)) {
    pQVar12 = pQVar5[10].q_ptr;
    if (pQVar12 == (QPaintEngine *)0x0) {
      qVar7 = pQVar5[3].systemTransform.m_matrix[1][0];
      dVar10 = (double)SUB84(qVar7,0);
      dVar11 = (double)(int)((ulong)qVar7 >> 0x20);
      auVar9._8_4_ = SUB84(dVar11,0);
      auVar9._0_8_ = dVar10;
      auVar9._12_4_ = (int)((ulong)dVar11 >> 0x20);
      __return_storage_ptr__->xp = dVar10;
      __return_storage_ptr__->yp = (qreal)auVar9._8_8_;
      __return_storage_ptr__->w =
           (double)(((long)*(int *)(pQVar5[3].systemTransform.m_matrix[1] + 1) -
                    (long)SUB84(qVar7,0)) + 1);
      iVar1 = *(int *)((long)pQVar5[3].systemTransform.m_matrix[1] + 0xc);
      goto LAB_003c2541;
    }
    bVar13 = *(byte *)&pQVar12[2].state;
  }
  if ((bVar13 & 2) == 0) {
    iVar1 = *(int *)&pQVar12[1]._vptr_QPaintEngine;
    iVar2 = *(int *)&pQVar12[1].state;
    iVar3 = *(int *)((long)&pQVar12[1]._vptr_QPaintEngine + 4);
    iVar4 = *(int *)((long)&pQVar12[1].state + 4);
    __return_storage_ptr__->xp = (double)iVar1;
    __return_storage_ptr__->yp = (double)iVar2;
    __return_storage_ptr__->w = (double)(iVar3 - iVar1);
    __return_storage_ptr__->h = (double)(iVar4 - iVar2);
    return __return_storage_ptr__;
  }
  qVar7 = *(qreal *)&pQVar12[1].gccaps;
  dVar10 = (double)SUB84(qVar7,0);
  dVar11 = (double)(int)((ulong)qVar7 >> 0x20);
  auVar8._8_4_ = SUB84(dVar11,0);
  auVar8._0_8_ = dVar10;
  auVar8._12_4_ = (int)((ulong)dVar11 >> 0x20);
  __return_storage_ptr__->xp = dVar10;
  __return_storage_ptr__->yp = (qreal)auVar8._8_8_;
  __return_storage_ptr__->w =
       (double)(((long)*(int *)&pQVar12[1].d_ptr.d - (long)SUB84(qVar7,0)) + 1);
  iVar1 = *(int *)((long)&pQVar12[1].d_ptr.d + 4);
LAB_003c2541:
  __return_storage_ptr__->h = (double)(((long)iVar1 - (long)(int)((ulong)qVar7 >> 0x20)) + 1);
  return __return_storage_ptr__;
}

Assistant:

QRectF QRasterPaintEngine::clipBoundingRect() const
{
    Q_D(const QRasterPaintEngine);

    const QClipData *clip = d->clip();

    if (!clip)
        return d->deviceRect;

    if (clip->hasRectClip)
        return clip->clipRect;

    return QRectF(clip->xmin, clip->ymin, clip->xmax - clip->xmin, clip->ymax - clip->ymin);
}